

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::startCallback(Highs *this,HighsCallbackType callback_type)

{
  bool bVar1;
  uint in_ESI;
  vector<bool,_std::allocator<bool>_> *in_RDI;
  bool callback_type_ok;
  undefined7 in_stack_ffffffffffffffd0;
  reference local_28;
  undefined3 in_stack_ffffffffffffffe8;
  undefined4 uVar2;
  vector<bool,_std::allocator<bool>_> *this_00;
  HighsStatus local_4;
  
  bVar1 = in_ESI < 10;
  uVar2 = CONCAT13(bVar1,in_stack_ffffffffffffffe8);
  if (bVar1) {
    this_00 = in_RDI;
    bVar1 = std::function::operator_cast_to_bool
                      ((function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
                        *)CONCAT17(bVar1,in_stack_ffffffffffffffd0));
    if (bVar1) {
      local_28 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (this_00,CONCAT44(in_ESI,uVar2));
      std::_Bit_reference::operator=(&local_28,true);
      if (in_ESI == 0) {
        *(undefined1 *)
         &in_RDI[0x5c].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage = 1;
      }
      local_4 = kOk;
    }
    else {
      highsLogUser((HighsLogOptions *)
                   &in_RDI[0x5a].super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset,kError,
                   "Cannot start callback when user_callback not defined\n");
      local_4 = kError;
    }
  }
  else {
    local_4 = kError;
  }
  return local_4;
}

Assistant:

HighsStatus Highs::startCallback(const HighsCallbackType callback_type) {
  const bool callback_type_ok =
      callback_type >= kCallbackMin && callback_type <= kCallbackMax;
  assert(callback_type_ok);
  if (!callback_type_ok) return HighsStatus::kError;
  if (!this->callback_.user_callback) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Cannot start callback when user_callback not defined\n");
    return HighsStatus::kError;
  }
  assert(int(this->callback_.active.size()) == kNumCallbackType);
  this->callback_.active[callback_type] = true;
  // Possibly modify the logging callback activity
  if (callback_type == kCallbackLogging)
    options_.log_options.user_callback_active = true;
  return HighsStatus::kOk;
}